

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

void slang::ast::GenvarSymbol::fromSyntax
               (Scope *parent,GenvarDeclarationSyntax *syntax,
               SmallVectorBase<const_slang::ast::GenvarSymbol_*> *results)

{
  Symbol *this;
  bool bVar1;
  Compilation *this_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  SourceLocation local_98;
  string_view local_90;
  Symbol *local_80;
  GenvarSymbol *genvar;
  undefined1 local_68 [8];
  Token name;
  IdentifierNameSyntax *id;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *__range2;
  Compilation *comp;
  SmallVectorBase<const_slang::ast::GenvarSymbol_*> *results_local;
  GenvarDeclarationSyntax *syntax_local;
  Scope *parent_local;
  
  this_00 = Scope::getCompilation(parent);
  join_0x00000010_0x00000000_ =
       slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::begin
                 (&syntax->identifiers);
  _id = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::end
                  (&syntax->identifiers);
  while (bVar1 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<const_slang::syntax::IdentifierNameSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::IdentifierNameSyntax_*,_unsigned_long,_const_slang::syntax::IdentifierNameSyntax_**,_const_slang::syntax::IdentifierNameSyntax_*&>
                 ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<const_slang::syntax::IdentifierNameSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::IdentifierNameSyntax_*,_unsigned_long,_const_slang::syntax::IdentifierNameSyntax_**,_const_slang::syntax::IdentifierNameSyntax_*&>
                               *)&__end2.index,
                              (iterator_base<const_slang::syntax::IdentifierNameSyntax_*> *)&id),
        bVar1) {
    name.info = (Info *)slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::
                        iterator_base<const_slang::syntax::IdentifierNameSyntax_*>::operator*
                                  ((iterator_base<const_slang::syntax::IdentifierNameSyntax_*> *)
                                   &__end2.index);
    local_68._0_2_ = (((IdentifierNameSyntax *)name.info)->identifier).kind;
    local_68[2] = (((IdentifierNameSyntax *)name.info)->identifier).field_0x2;
    local_68[3] = (((IdentifierNameSyntax *)name.info)->identifier).numFlags.raw;
    local_68._4_4_ = (((IdentifierNameSyntax *)name.info)->identifier).rawLen;
    name._0_8_ = (((IdentifierNameSyntax *)name.info)->identifier).info;
    _genvar = parsing::Token::valueText((Token *)local_68);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&genvar);
    if (!bVar1) {
      local_90 = parsing::Token::valueText((Token *)local_68);
      local_98 = parsing::Token::location((Token *)local_68);
      local_80 = &BumpAllocator::
                  emplace<slang::ast::GenvarSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                            (&this_00->super_BumpAllocator,&local_90,&local_98)->super_Symbol;
      Symbol::setSyntax(local_80,(SyntaxNode *)name.info);
      this = local_80;
      syntax_00 = slang::syntax::SyntaxList::operator_cast_to_span
                            ((SyntaxList *)&(syntax->super_MemberSyntax).attributes);
      Symbol::setAttributes(this,parent,syntax_00);
      SmallVectorBase<const_slang::ast::GenvarSymbol_*>::push_back
                (results,(GenvarSymbol **)&local_80);
    }
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<const_slang::syntax::IdentifierNameSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::IdentifierNameSyntax_*,_unsigned_long,_const_slang::syntax::IdentifierNameSyntax_**,_const_slang::syntax::IdentifierNameSyntax_*&>
    ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<const_slang::syntax::IdentifierNameSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::IdentifierNameSyntax_*,_unsigned_long,_const_slang::syntax::IdentifierNameSyntax_**,_const_slang::syntax::IdentifierNameSyntax_*&>
                  *)&__end2.index);
  }
  return;
}

Assistant:

void GenvarSymbol::fromSyntax(const Scope& parent, const GenvarDeclarationSyntax& syntax,
                              SmallVectorBase<const GenvarSymbol*>& results) {
    auto& comp = parent.getCompilation();
    for (auto id : syntax.identifiers) {
        auto name = id->identifier;
        if (name.valueText().empty())
            continue;

        auto genvar = comp.emplace<GenvarSymbol>(name.valueText(), name.location());
        genvar->setSyntax(*id);
        genvar->setAttributes(parent, syntax.attributes);
        results.push_back(genvar);
    }
}